

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

int hostkey_method_ssh_dss_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  int iVar2;
  DSA *in_RAX;
  DSA *dsactx;
  DSA *local_28;
  
  local_28 = in_RAX;
  if ((DSA *)*abstract != (DSA *)0x0) {
    DSA_free((DSA *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_dsa_new_private(&local_28,session,privkeyfile,passphrase);
  iVar2 = -1;
  if (iVar1 == 0) {
    *abstract = local_28;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_dss_initPEM(LIBSSH2_SESSION * session,
                               const char *privkeyfile,
                               unsigned const char *passphrase,
                               void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    int ret;

    if (*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_dsa_new_private(&dsactx, session, privkeyfile, passphrase);
    if (ret) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}